

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManPrintNpnClasses(Gia_Man_t *p)

{
  int iVar1;
  char **ppcVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  void *__ptr;
  int *piVar3;
  Gia_Obj_t *pRoot;
  uint *puVar4;
  bool local_40d;
  uint *pTruth;
  int local_3d8;
  int Counter2;
  int Counter;
  int nTotal;
  int OtherClasses2;
  int OtherClasses;
  int Class;
  int iFan;
  int k;
  int i;
  int ClassCounts [222];
  int *pLutClass;
  Vec_Int_t *vVisited;
  Vec_Int_t *vTruth;
  Vec_Int_t *vLeaves;
  char **pNames;
  Gia_Man_t *p_local;
  
  ppcVar2 = Kit_DsdNpn4ClassNames();
  memset(&k,0,0x378);
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMan.c"
                  ,0x2b1,"void Gia_ManPrintNpnClasses(Gia_Man_t *)");
  }
  iVar1 = Gia_ManLutSizeMax(p);
  if (iVar1 < 5) {
    p_00 = Vec_IntAlloc(100);
    p_01 = Vec_IntAlloc(100);
    p_02 = Vec_IntAlloc(0x10000);
    iVar1 = Gia_ManObjNum(p);
    __ptr = calloc((long)iVar1,4);
    Gia_ManCleanTruth(p);
    for (iFan = 1; iVar1 = Gia_ManObjNum(p), iFan < iVar1; iFan = iFan + 1) {
      iVar1 = Gia_ObjIsLut(p,iFan);
      if ((iVar1 != 0) && (iVar1 = Gia_ObjLutSize(p,iFan), iVar1 < 5)) {
        Vec_IntClear(p_00);
        for (Class = 0; iVar1 = Gia_ObjLutSize(p,iFan), Class < iVar1; Class = Class + 1) {
          piVar3 = Gia_ObjLutFanins(p,iFan);
          Vec_IntPush(p_00,piVar3[Class]);
        }
        for (; Class < 4; Class = Class + 1) {
          Vec_IntPush(p_00,0);
        }
        pRoot = Gia_ManObj(p,iFan);
        puVar4 = Gia_ManConvertAigToTruth(p,pRoot,p_00,p_02,p_01);
        iVar1 = Dar_LibReturnClass(*puVar4);
        (&k)[iVar1] = (&k)[iVar1] + 1;
        *(int *)((long)__ptr + (long)iFan * 4) = iVar1;
      }
    }
    Vec_IntFree(p_00);
    Vec_IntFree(p_02);
    Vec_IntFree(p_01);
    Vec_IntFreeP(&p->vTruths);
    Counter2 = 0;
    for (iFan = 0; iFan < 0xde; iFan = iFan + 1) {
      Counter2 = (&k)[iFan] + Counter2;
    }
    Abc_Print(1,"NPN CLASS STATISTICS (for %d LUT4 present in the current mapping):\n",
              (ulong)(uint)Counter2);
    nTotal = 0;
    for (iFan = 0; iFan < 0xde; iFan = iFan + 1) {
      if ((&k)[iFan] != 0) {
        nTotal = (&k)[iFan] + nTotal;
        Abc_Print(1,"Class %3d :  Count = %6d   (%7.2f %%)   %s\n",
                  ((double)(&k)[iFan] * 100.0) / (double)(Counter2 + 1),(ulong)(uint)iFan,
                  (ulong)(uint)(&k)[iFan],ppcVar2[iFan]);
      }
    }
    Abc_Print(1,"Other     :  Count = %6d   (%7.2f %%)\n",
              ((double)(Counter2 - nTotal) * 100.0) / (double)(Counter2 + 1),
              (ulong)(uint)(Counter2 - nTotal));
    Counter = 0;
    nTotal = 0;
    if (p->pRefs != (int *)0x0) {
      free(p->pRefs);
      p->pRefs = (int *)0x0;
    }
    Gia_ManSetRefsMapped(p);
    for (iFan = 1; iVar1 = Gia_ManObjNum(p), iFan < iVar1; iFan = iFan + 1) {
      iVar1 = Gia_ObjIsLut(p,iFan);
      if ((iVar1 != 0) && (*(int *)((long)__ptr + (long)iFan * 4) == 0x6d)) {
        pTruth._4_4_ = 0;
        local_3d8 = 0;
        for (Class = 0; iVar1 = Gia_ObjLutSize(p,iFan), Class < iVar1; Class = Class + 1) {
          piVar3 = Gia_ObjLutFanins(p,iFan);
          iVar1 = piVar3[Class];
          local_3d8 = (uint)(*(int *)((long)__ptr + (long)iVar1 * 4) == 0x6d) + local_3d8;
          local_40d = false;
          if (*(int *)((long)__ptr + (long)iVar1 * 4) == 0x6d) {
            iVar1 = Gia_ObjRefNumId(p,iVar1);
            local_40d = iVar1 == 1;
          }
          pTruth._4_4_ = (uint)local_40d + pTruth._4_4_;
        }
        nTotal = (uint)(1 < local_3d8) + nTotal;
        Counter = (uint)(1 < pTruth._4_4_) + Counter;
      }
    }
    if (p->pRefs != (int *)0x0) {
      free(p->pRefs);
      p->pRefs = (int *)0x0;
    }
    Abc_Print(1,
              "Approximate number of 4:1 MUX structures: All = %6d  (%7.2f %%)  MFFC = %6d  (%7.2f %%)\n"
              ,((double)nTotal * 100.0) / (double)(Counter2 + 1),
              ((double)Counter * 100.0) / (double)(Counter2 + 1),(ulong)(uint)nTotal,
              (ulong)(uint)Counter);
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    return;
  }
  __assert_fail("Gia_ManLutSizeMax( p ) <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMan.c"
                ,0x2b2,"void Gia_ManPrintNpnClasses(Gia_Man_t *)");
}

Assistant:

void Gia_ManPrintNpnClasses( Gia_Man_t * p )
{
    extern char ** Kit_DsdNpn4ClassNames();
    char ** pNames = Kit_DsdNpn4ClassNames();
    Vec_Int_t * vLeaves, * vTruth, * vVisited;
    int * pLutClass, ClassCounts[222] = {0};
    int i, k, iFan, Class, OtherClasses, OtherClasses2, nTotal, Counter, Counter2;
    unsigned * pTruth;
    assert( Gia_ManHasMapping(p) );
    assert(  Gia_ManLutSizeMax( p ) <= 4 );
    vLeaves   = Vec_IntAlloc( 100 );
    vVisited  = Vec_IntAlloc( 100 );
    vTruth    = Vec_IntAlloc( (1<<16) );
    pLutClass = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManCleanTruth( p );
    Gia_ManForEachLut( p, i )
    {
        if ( Gia_ObjLutSize(p,i) > 4 )
            continue;
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, i, iFan, k )
            Vec_IntPush( vLeaves, iFan );
        for ( ; k < 4; k++ )
            Vec_IntPush( vLeaves, 0 );
        pTruth = Gia_ManConvertAigToTruth( p, Gia_ManObj(p, i), vLeaves, vTruth, vVisited );
        Class = Dar_LibReturnClass( *pTruth );
        ClassCounts[ Class ]++;
        pLutClass[i] = Class;
    }
    Vec_IntFree( vLeaves );
    Vec_IntFree( vTruth );
    Vec_IntFree( vVisited );
    Vec_IntFreeP( &p->vTruths );
    nTotal = 0;
    for ( i = 0; i < 222; i++ )
        nTotal += ClassCounts[i];
    Abc_Print( 1, "NPN CLASS STATISTICS (for %d LUT4 present in the current mapping):\n", nTotal );
    OtherClasses = 0;
    for ( i = 0; i < 222; i++ )
    {
        if ( ClassCounts[i] == 0 )
            continue;
//        if ( 100.0 * ClassCounts[i] / (nTotal+1) < 0.1 ) // do not show anything below 0.1 percent
//            continue;
        OtherClasses += ClassCounts[i];
        Abc_Print( 1, "Class %3d :  Count = %6d   (%7.2f %%)   %s\n", 
            i, ClassCounts[i], 100.0 * ClassCounts[i] / (nTotal+1), pNames[i] );
    }
    OtherClasses = nTotal - OtherClasses;
    Abc_Print( 1, "Other     :  Count = %6d   (%7.2f %%)\n", 
        OtherClasses, 100.0 * OtherClasses / (nTotal+1) );
    // count the number of LUTs that have MUX function and two fanins with MUX functions
    OtherClasses = OtherClasses2 = 0;
    ABC_FREE( p->pRefs );
    Gia_ManSetRefsMapped( p );
    Gia_ManForEachLut( p, i )
    {
        if ( pLutClass[i] != 109 )
            continue;
        Counter = Counter2 = 0;
        Gia_LutForEachFanin( p, i, iFan, k )
        {
            Counter  += (pLutClass[iFan] == 109);
            Counter2 += (pLutClass[iFan] == 109) && (Gia_ObjRefNumId(p, iFan) == 1);
        }
        OtherClasses  += (Counter > 1);
        OtherClasses2 += (Counter2 > 1);
//            Abc_Print( 1, "%d -- ", pLutClass[i] );
//            Gia_LutForEachFanin( p, i, iFan, k )
//                Abc_Print( 1, "%d ", pLutClass[iFan] );
//            Abc_Print( 1, "\n" );
    }
    ABC_FREE( p->pRefs );
    Abc_Print( 1, "Approximate number of 4:1 MUX structures: All = %6d  (%7.2f %%)  MFFC = %6d  (%7.2f %%)\n", 
        OtherClasses,  100.0 * OtherClasses  / (nTotal+1),
        OtherClasses2, 100.0 * OtherClasses2 / (nTotal+1) );
    ABC_FREE( pLutClass );
}